

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O1

void __thiscall connector::on_event(connector *this,int events)

{
  imanager *piVar1;
  network *pnVar2;
  uint uVar3;
  
  if (this->connected_ != true) {
    if ((events & 4U) == 0) {
      __assert_fail("events & EVENT_WRITE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/protonet/connector.cpp"
                    ,0x23,"virtual void connector::on_event(int)");
    }
    uVar3 = get_socket_err(this->connectfd_);
    if (uVar3 != 0) {
      piVar1 = (this->super_session).manager_;
      (**piVar1->_vptr_imanager)
                (piVar1,(ulong)(uint)(this->super_session).super_iobject.netid_,(ulong)uVar3);
      pnVar2 = (this->super_session).network_;
      (*(pnVar2->super_inetwork)._vptr_inetwork[5])
                (pnVar2,(ulong)(uint)(this->super_session).super_iobject.netid_);
      return;
    }
    this->connected_ = true;
    session::init(&this->super_session,(EVP_PKEY_CTX *)(ulong)(uint)this->connectfd_);
    piVar1 = (this->super_session).manager_;
    (**piVar1->_vptr_imanager)(piVar1,(ulong)(uint)(this->super_session).super_iobject.netid_,0);
  }
  session::on_event(&this->super_session,events);
  return;
}

Assistant:

void connector::on_event(int events)
{
    if (connected_)
    {
        session::on_event(events);
        return;
    }

    assert(events & EVENT_WRITE);
    int error = get_socket_err(connectfd_);
    if (error != 0)
    {
        on_error(error);
        return;
    }

    connected_ = true;
    session::init(connectfd_);
    manager_->on_accept(netid_, 0);
    session::on_event(events);
}